

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark_branchfree.cpp
# Opt level: O2

result_t benchmark_sum_dividers<long,std::vector<libdivide::divider<long,(libdivide::Branching)1>,std::allocator<libdivide::divider<long,(libdivide::Branching)1>>>>
                   (vector<libdivide::divider<long,_(libdivide::Branching)1>,_std::allocator<libdivide::divider<long,_(libdivide::Branching)1>_>_>
                    *dividers,size_t iters)

{
  long lVar1;
  size_t sVar2;
  long lVar3;
  size_t sVar4;
  result_t rVar5;
  
  sVar4 = 0;
  lVar1 = std::chrono::_V2::system_clock::now();
  while (iters != 0) {
    sVar2 = iters;
    if ((long)iters < 3) {
      sVar2 = 2;
    }
    sVar2 = sum_dividers<long,std::vector<libdivide::divider<long,(libdivide::Branching)1>,std::allocator<libdivide::divider<long,(libdivide::Branching)1>>>>
                      (sVar2,dividers);
    sVar4 = sVar4 + sVar2;
    iters = iters - 1;
  }
  lVar3 = std::chrono::_V2::system_clock::now();
  rVar5.duration = (double)(lVar3 - lVar1) / 1000000000.0;
  rVar5.sum = sVar4;
  return rVar5;
}

Assistant:

NOINLINE result_t benchmark_sum_dividers(const D& dividers, size_t iters) {
    auto t1 = std::chrono::system_clock::now();
    size_t sum = 0;

    for (; iters > 0; iters--) {
        // Unsigned branchfree divider cannot be 1
        T numerator = std::max((T)2, (T)iters);
        sum += sum_dividers(numerator, dividers);
    }

    auto t2 = std::chrono::system_clock::now();
    std::chrono::duration<double> seconds = t2 - t1;
    return result_t{seconds.count(), sum};
}